

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

int Fra_SmlNodesAreEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = *(long *)((long)(pObj0->field_5).pData + 0x38);
  iVar1 = *(int *)(lVar3 + 0x14);
  iVar2 = *(int *)(lVar3 + 0x18);
  if (iVar2 < iVar1) {
    lVar4 = 0;
    do {
      if (*(int *)((long)(pObj0->Id * iVar1) * 4 + (long)iVar2 * 4 + lVar3 + 0x28 + lVar4 * 4) !=
          *(int *)((long)(pObj1->Id * iVar1) * 4 + (long)iVar2 * 4 + lVar3 + 0x28 + lVar4 * 4)) {
        return 0;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 - iVar2 != (int)lVar4);
  }
  return 1;
}

Assistant:

int Fra_SmlNodesAreEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj0->pData;
    unsigned * pSims0, * pSims1;
    int i;
    pSims0 = Fra_ObjSim(p->pSml, pObj0->Id);
    pSims1 = Fra_ObjSim(p->pSml, pObj1->Id);
    for ( i = p->pSml->nWordsPref; i < p->pSml->nWordsTotal; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}